

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unary_expr.hpp
# Opt level: O0

rt_expression_interface<double> * __thiscall
viennamath::rt_unary_expr<viennamath::rt_expression_interface<double>_>::substitute
          (rt_unary_expr<viennamath::rt_expression_interface<double>_> *this,
          rt_expression_interface<double> *e,rt_expression_interface<double> *repl)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  element_type *peVar4;
  undefined4 extraout_var_00;
  element_type *peVar5;
  undefined4 extraout_var_01;
  rt_expression_interface<double> *repl_local;
  rt_expression_interface<double> *e_local;
  rt_unary_expr<viennamath::rt_expression_interface<double>_> *this_local;
  
  uVar1 = (*(this->super_rt_expression_interface<double>)._vptr_rt_expression_interface[0xb])
                    (this,e);
  if ((uVar1 & 1) == 0) {
    this_local = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)operator_new(0x18);
    peVar4 = std::auto_ptr<viennamath::rt_expression_interface<double>_>::operator->(&this->expr_);
    iVar2 = (*peVar4->_vptr_rt_expression_interface[0xe])(peVar4,e,repl);
    peVar5 = std::auto_ptr<viennamath::op_interface<viennamath::rt_expression_interface<double>_>_>
             ::operator->(&this->op_);
    iVar3 = (*peVar5->_vptr_op_interface[2])();
    rt_unary_expr(this_local,(rt_expression_interface<double> *)CONCAT44(extraout_var_00,iVar2),
                  (op_interface_type *)CONCAT44(extraout_var_01,iVar3));
  }
  else {
    iVar2 = (*repl->_vptr_rt_expression_interface[2])();
    this_local = (rt_unary_expr<viennamath::rt_expression_interface<double>_> *)
                 CONCAT44(extraout_var,iVar2);
  }
  return &this_local->super_rt_expression_interface<double>;
}

Assistant:

InterfaceType * substitute(const InterfaceType * e,
                                 const InterfaceType * repl) const
      {
        if (deep_equal(e))
          return repl->clone();

        return new rt_unary_expr(expr_->substitute(e, repl),
                              op_->clone());
      }